

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::PrintTraceFormatVersion(cmake *this)

{
  bool bVar1;
  TraceFormat TVar2;
  Value *pVVar3;
  ulong uVar4;
  cmGeneratedFileStream *pcVar5;
  ostream *poVar6;
  Value *in_RCX;
  cmGeneratedFileStream *f;
  String local_180;
  Value local_160;
  Value local_138;
  allocator<char> local_109;
  String local_108;
  Value local_e8;
  undefined1 local_c0 [8];
  StreamWriterBuilder builder;
  Value version;
  Value val;
  undefined1 local_30 [8];
  string msg;
  cmake *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = GetTrace(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_30);
    TVar2 = GetTraceFormat(this);
    if (TVar2 == Undefined) {
      std::__cxx11::string::operator=
                ((string *)local_30,"INTERNAL ERROR: Trace format is Undefined");
    }
    else if (TVar2 == Human) {
      std::__cxx11::string::operator=((string *)local_30,"");
    }
    else if (TVar2 == JSONv1) {
      Json::Value::Value((Value *)&version.limit_,nullValue);
      Json::Value::Value((Value *)&builder.settings_.limit_,nullValue);
      Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_c0);
      Json::Value::Value(&local_e8,"");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"indentation",&local_109);
      pVVar3 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_c0,&local_108);
      Json::Value::operator=(pVVar3,&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      Json::Value::~Value(&local_e8);
      Json::Value::Value(&local_138,1);
      pVVar3 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"major");
      Json::Value::operator=(pVVar3,&local_138);
      Json::Value::~Value(&local_138);
      Json::Value::Value(&local_160,2);
      pVVar3 = Json::Value::operator[]((Value *)&builder.settings_.limit_,"minor");
      Json::Value::operator=(pVVar3,&local_160);
      Json::Value::~Value(&local_160);
      pVVar3 = Json::Value::operator[]((Value *)&version.limit_,"version");
      Json::Value::operator=(pVVar3,(Value *)&builder.settings_.limit_);
      Json::writeString_abi_cxx11_(&local_180,(Json *)local_c0,(Factory *)&version.limit_,in_RCX);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_c0);
      Json::Value::~Value((Value *)&builder.settings_.limit_);
      Json::Value::~Value((Value *)&version.limit_);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar5 = GetTraceFile(this);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&(pcVar5->super_ofstream).
                                        super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream +
                                (long)(pcVar5->super_ofstream).
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream[-3]));
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)pcVar5,(string *)local_30);
        std::operator<<(poVar6,'\n');
      }
      else {
        cmSystemTools::Message((string *)local_30,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void cmake::PrintTraceFormatVersion()
{
  if (!this->GetTrace()) {
    return;
  }

  std::string msg;

  switch (this->GetTraceFormat()) {
    case TraceFormat::JSONv1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::Value version;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      version["major"] = 1;
      version["minor"] = 2;
      val["version"] = version;
      msg = Json::writeString(builder, val);
#endif
      break;
    }
    case TraceFormat::Human:
      msg = "";
      break;
    case TraceFormat::Undefined:
      msg = "INTERNAL ERROR: Trace format is Undefined";
      break;
  }

  if (msg.empty()) {
    return;
  }

  auto& f = this->GetTraceFile();
  if (f) {
    f << msg << '\n';
  } else {
    cmSystemTools::Message(msg);
  }
}